

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::Finalize(Segment *this)

{
  char *pcVar1;
  int iVar2;
  uint32_t uVar3;
  int32 iVar4;
  uint64_t uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int64_t iVar9;
  undefined8 uVar10;
  long lVar11;
  char **in_RDI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char *doc_type;
  int64_t pos;
  int64_t segment_size;
  bool cues_open;
  char *name;
  double track_duration;
  double nano_per_frame;
  int i;
  int num_tracks;
  double duration;
  Cluster *old_cluster;
  char *in_stack_ffffffffffffff28;
  SeekHead *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int32 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Segment *in_stack_ffffffffffffff48;
  IMkvWriter *in_stack_ffffffffffffff60;
  undefined4 uVar19;
  undefined4 uVar20;
  Segment *in_stack_ffffffffffffff78;
  double dVar21;
  IMkvWriter *in_stack_ffffffffffffffa0;
  Segment *in_stack_ffffffffffffffa8;
  int local_28;
  char *local_20;
  Segment *in_stack_ffffffffffffffe8;
  char **ppcVar22;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar23;
  
  ppcVar22 = in_RDI;
  iVar2 = WriteFramesAll(in_stack_ffffffffffffff78);
  if (iVar2 < 0) {
    bVar23 = false;
  }
  else if ((((*(int *)(in_RDI + 0x129) == 1) && ((*(byte *)((long)in_RDI + 0x94e) & 1) == 0)) ||
           (*(int *)((long)in_RDI + 0x114) < 1)) ||
          ((in_stack_ffffffffffffffe8 =
                 *(Segment **)(in_RDI[0x21] + (long)(*(int *)((long)in_RDI + 0x114) + -1) * 8),
           in_stack_ffffffffffffffe8 != (Segment *)0x0 &&
           (bVar23 = Cluster::Finalize((Cluster *)
                                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                                       ,SUB81((ulong)ppcVar22 >> 0x38,0),
                                       (uint64_t)in_stack_ffffffffffffffe8), bVar23)))) {
    if (*(int *)(in_RDI + 0x129) == 2) {
      if ((((ulong)in_RDI[0x1e] & 1) != 0) && (in_RDI[0x1b] != (char *)0x0)) {
        MkvWriter::Close((MkvWriter *)in_stack_ffffffffffffff30);
        *(int *)(in_RDI + 0x19) = *(int *)(in_RDI + 0x19) + 1;
      }
      pcVar7 = in_RDI[0x2a];
      uVar19 = 0x43300000;
      uVar20 = 0x45300000;
      auVar12._8_4_ = (int)((ulong)pcVar7 >> 0x20);
      auVar12._0_8_ = pcVar7;
      auVar12._12_4_ = 0x45300000;
      dVar21 = 4503599627370496.0;
      pcVar1 = in_RDI[0x29];
      auVar15._8_4_ = (int)((ulong)pcVar1 >> 0x20);
      auVar15._0_8_ = pcVar1;
      auVar15._12_4_ = 0x45300000;
      uVar5 = SegmentInfo::timecode_scale((SegmentInfo *)(in_RDI + 0xd));
      auVar16._8_4_ = (int)(uVar5 >> 0x20);
      auVar16._0_8_ = uVar5;
      auVar16._12_4_ = uVar20;
      local_20 = (char *)(((auVar12._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)pcVar7) - 4503599627370496.0) +
                          (auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)pcVar1) - 4503599627370496.0)) /
                         ((auVar16._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(uVar19,(int)uVar5) - dVar21)));
      if ((double)in_RDI[0x12e] <= 0.0) {
        if ((in_RDI[0x29] == (char *)0x0) && (((ulong)in_RDI[0x12a] & 1) != 0)) {
          uVar3 = Tracks::track_entries_size((Tracks *)(in_RDI + 0x13));
          for (local_28 = 0; local_28 < (int)uVar3; local_28 = local_28 + 1) {
            if ((char *)0x1 < in_RDI[(long)local_28 + 0xa9]) {
              pcVar7 = in_RDI[(long)local_28 + 0x2b];
              in_stack_ffffffffffffff38 = 0x43300000;
              in_stack_ffffffffffffff3c = 0x45300000;
              in_stack_ffffffffffffff40 = 0;
              in_stack_ffffffffffffff44 = 0;
              auVar13._8_4_ = (int)((ulong)pcVar7 >> 0x20);
              auVar13._0_8_ = pcVar7;
              auVar13._12_4_ = 0x45300000;
              in_stack_ffffffffffffff48 = (Segment *)0x4330000000000000;
              pcVar6 = in_RDI[(long)local_28 + 0xa9] + -1;
              auVar18._8_4_ = (int)((ulong)pcVar6 >> 0x20);
              auVar18._0_8_ = pcVar6;
              auVar18._12_4_ = 0x45300000;
              pcVar1 = in_RDI[(long)local_28 + 0x2b];
              auVar14._8_4_ = (int)((ulong)pcVar1 >> 0x20);
              auVar14._0_8_ = pcVar1;
              auVar14._12_4_ = 0x45300000;
              in_stack_ffffffffffffff60 =
                   (IMkvWriter *)
                   ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)pcVar1) - 4503599627370496.0) +
                   ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)pcVar7) - 4503599627370496.0)) /
                   ((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)pcVar6) - 4503599627370496.0)));
              uVar5 = SegmentInfo::timecode_scale((SegmentInfo *)(in_RDI + 0xd));
              auVar17._8_4_ = (int)(uVar5 >> 0x20);
              auVar17._0_8_ = uVar5;
              auVar17._12_4_ = in_stack_ffffffffffffff3c;
              pcVar7 = (char *)((double)in_stack_ffffffffffffff60 /
                               ((auVar17._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(in_stack_ffffffffffffff38,(int)uVar5) -
                               (double)in_stack_ffffffffffffff48)));
              if ((double)local_20 < (double)pcVar7) {
                local_20 = pcVar7;
              }
            }
          }
        }
      }
      else {
        local_20 = in_RDI[0x12e];
      }
      SegmentInfo::set_duration((SegmentInfo *)(in_RDI + 0xd),(double)local_20);
      bVar23 = SegmentInfo::Finalize
                         ((SegmentInfo *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (IMkvWriter *)in_stack_ffffffffffffff30);
      if (!bVar23) {
        return false;
      }
      if ((*(byte *)((long)in_RDI + 0x94d) & 1) != 0) {
        in_stack_ffffffffffffff30 = (SeekHead *)(in_RDI + 4);
        uVar5 = MaxOffset(in_stack_ffffffffffffff48);
        bVar23 = SeekHead::AddSeekEntry(in_stack_ffffffffffffff30,0x1c53bb6b,uVar5);
        if (!bVar23) {
          return false;
        }
      }
      if (((ulong)in_RDI[0x1e] & 1) != 0) {
        if (in_RDI[0x1c] == (char *)0x0) {
          return false;
        }
        bVar23 = UpdateChunkName(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,in_RDI)
        ;
        if (!bVar23) {
          return false;
        }
        bVar23 = MkvWriter::Open((MkvWriter *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                 (char *)in_stack_ffffffffffffff30);
        in_stack_ffffffffffffff28 = (char *)0x0;
        if (!bVar23) {
          return false;
        }
      }
      pcVar7 = (char *)(**(code **)(*(long *)in_RDI[0x12f] + 8))();
      in_RDI[0x20] = pcVar7;
      if (((*(byte *)((long)in_RDI + 0x94d) & 1) != 0) &&
         (bVar23 = Cues::Write((Cues *)CONCAT44(uVar20,uVar19),in_stack_ffffffffffffff60), !bVar23))
      {
        return false;
      }
      bVar23 = SeekHead::Finalize((SeekHead *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (!bVar23) {
        return false;
      }
      uVar8 = (**(code **)(*(long *)in_RDI[0x131] + 0x18))();
      if ((uVar8 & 1) != 0) {
        if (in_RDI[300] == (char *)0xffffffffffffffff) {
          return false;
        }
        iVar9 = MaxOffset(in_stack_ffffffffffffff48);
        if (iVar9 < 1) {
          return false;
        }
        uVar10 = (**(code **)(*(long *)in_RDI[0x131] + 8))();
        UpdateDocTypeVersion
                  ((Segment *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (*(int *)(in_RDI + 0x12d) != *(int *)((long)in_RDI + 0x96c)) {
          iVar2 = (**(code **)(*(long *)in_RDI[0x131] + 0x10))(in_RDI[0x131],0);
          if (iVar2 != 0) {
            return false;
          }
          DocTypeIsWebm(in_stack_ffffffffffffffe8);
          bVar23 = WriteEbmlHeader((IMkvWriter *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (uint64_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          if (!bVar23) {
            return false;
          }
          lVar11 = (**(code **)(*(long *)in_RDI[0x131] + 8))();
          if (lVar11 != *(int *)((long)in_RDI + 0x954)) {
            return false;
          }
          *(undefined4 *)((long)in_RDI + 0x96c) = *(undefined4 *)(in_RDI + 0x12d);
        }
        iVar2 = (**(code **)(*(long *)in_RDI[0x131] + 0x10))(in_RDI[0x131],in_RDI[300]);
        if (iVar2 != 0) {
          return false;
        }
        iVar4 = WriteUIntSize((IMkvWriter *)in_stack_ffffffffffffff48,
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c);
        if (iVar4 != 0) {
          return false;
        }
        iVar2 = (**(code **)(*(long *)in_RDI[0x131] + 0x10))(in_RDI[0x131],uVar10);
        if (iVar2 != 0) {
          return false;
        }
      }
      if (((ulong)in_RDI[0x1e] & 1) != 0) {
        if ((in_RDI[0x1c] == (char *)0x0) || (in_RDI[0x1d] == (char *)0x0)) {
          return false;
        }
        MkvWriter::Close((MkvWriter *)in_stack_ffffffffffffff30);
        MkvWriter::Close((MkvWriter *)in_stack_ffffffffffffff30);
      }
    }
    bVar23 = true;
  }
  else {
    bVar23 = false;
  }
  return bVar23;
}

Assistant:

bool Segment::Finalize() {
  if (WriteFramesAll() < 0)
    return false;

  // In kLive mode, call Cluster::Finalize only if |accurate_cluster_duration_|
  // is set. In all other modes, always call Cluster::Finalize.
  if ((mode_ == kLive ? accurate_cluster_duration_ : true) &&
      cluster_list_size_ > 0) {
    // Update last cluster's size
    Cluster* const old_cluster = cluster_list_[cluster_list_size_ - 1];

    // For the last frame of the last Cluster, we don't write it as a BlockGroup
    // with Duration unless the frame itself has duration set explicitly.
    if (!old_cluster || !old_cluster->Finalize(false, 0))
      return false;
  }

  if (mode_ == kFile) {
    if (chunking_ && chunk_writer_cluster_) {
      chunk_writer_cluster_->Close();
      chunk_count_++;
    }

    double duration =
        (static_cast<double>(last_timestamp_) + last_block_duration_) /
        segment_info_.timecode_scale();
    if (duration_ > 0.0) {
      duration = duration_;
    } else {
      if (last_block_duration_ == 0 && estimate_file_duration_) {
        const int num_tracks = static_cast<int>(tracks_.track_entries_size());
        for (int i = 0; i < num_tracks; ++i) {
          if (track_frames_written_[i] < 2)
            continue;

          // Estimate the duration for the last block of a Track.
          const double nano_per_frame =
              static_cast<double>(last_track_timestamp_[i]) /
              (track_frames_written_[i] - 1);
          const double track_duration =
              (last_track_timestamp_[i] + nano_per_frame) /
              segment_info_.timecode_scale();
          if (track_duration > duration)
            duration = track_duration;
        }
      }
    }
    segment_info_.set_duration(duration);
    if (!segment_info_.Finalize(writer_header_))
      return false;

    if (output_cues_)
      if (!seek_head_.AddSeekEntry(libwebm::kMkvCues, MaxOffset()))
        return false;

    if (chunking_) {
      if (!chunk_writer_cues_)
        return false;

      char* name = NULL;
      if (!UpdateChunkName("cues", &name))
        return false;

      const bool cues_open = chunk_writer_cues_->Open(name);
      delete[] name;
      if (!cues_open)
        return false;
    }

    cluster_end_offset_ = writer_cluster_->Position();

    // Write the seek headers and cues
    if (output_cues_)
      if (!cues_.Write(writer_cues_))
        return false;

    if (!seek_head_.Finalize(writer_header_))
      return false;

    if (writer_header_->Seekable()) {
      if (size_position_ == -1)
        return false;

      const int64_t segment_size = MaxOffset();
      if (segment_size < 1)
        return false;

      const int64_t pos = writer_header_->Position();
      UpdateDocTypeVersion();
      if (doc_type_version_ != doc_type_version_written_) {
        if (writer_header_->Position(0))
          return false;

        const char* const doc_type =
            DocTypeIsWebm() ? kDocTypeWebm : kDocTypeMatroska;
        if (!WriteEbmlHeader(writer_header_, doc_type_version_, doc_type))
          return false;
        if (writer_header_->Position() != ebml_header_size_)
          return false;

        doc_type_version_written_ = doc_type_version_;
      }

      if (writer_header_->Position(size_position_))
        return false;

      if (WriteUIntSize(writer_header_, segment_size, 8))
        return false;

      if (writer_header_->Position(pos))
        return false;
    }

    if (chunking_) {
      // Do not close any writers until the segment size has been written,
      // otherwise the size may be off.
      if (!chunk_writer_cues_ || !chunk_writer_header_)
        return false;

      chunk_writer_cues_->Close();
      chunk_writer_header_->Close();
    }
  }

  return true;
}